

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O1

void __thiscall
leveldb::Coding_Varint32Truncation_Test::TestBody(Coding_Varint32Truncation_Test *this)

{
  char cVar1;
  char *extraout_RAX;
  char *pcVar2;
  int line;
  undefined8 *puVar3;
  char *in_R9;
  char *pcVar4;
  uint32_t result;
  AssertionResult gtest_ar_;
  uint32_t large_value;
  AssertionResult gtest_ar;
  string s;
  uint32_t local_8c;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Message local_80;
  undefined8 *local_78;
  uint local_6c;
  AssertHelper local_68;
  string local_60;
  string local_40;
  
  local_6c = 0x80000064;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  PutVarint32(&local_40,0x80000064);
  if (local_40._M_string_length != 1) {
    pcVar4 = (char *)0x0;
    pcVar2 = extraout_RAX;
    do {
      if ((long)pcVar4 < 1) {
LAB_0010a607:
        pcVar2 = GetVarint32PtrFallback
                           (local_40._M_dataplus._M_p,local_40._M_dataplus._M_p + (long)pcVar4,
                            &local_8c);
      }
      else {
        cVar1 = *local_40._M_dataplus._M_p;
        if (-1 < cVar1) {
          pcVar2 = local_40._M_dataplus._M_p + 1;
          local_8c = (int)cVar1;
        }
        if (cVar1 < '\0') goto LAB_0010a607;
      }
      local_80.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)(pcVar2 == (char *)0x0);
      local_78 = (undefined8 *)0x0;
      if (!(bool)local_80.ss_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_1_) {
        testing::Message::Message((Message *)&local_88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_60,(internal *)&local_80,
                   (AssertionResult *)"GetVarint32Ptr(s.data(), s.data() + len, &result) == nullptr"
                   ,"false","true",in_R9);
        pcVar2 = (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p);
        line = 0x92;
        goto LAB_0010a76d;
      }
      pcVar4 = pcVar4 + 1;
      pcVar2 = (char *)(local_40._M_string_length - 1);
    } while (pcVar4 < pcVar2);
  }
  if (((long)local_40._M_string_length < 1) || (*local_40._M_dataplus._M_p < '\0')) {
    pcVar2 = GetVarint32PtrFallback
                       (local_40._M_dataplus._M_p,
                        local_40._M_dataplus._M_p + local_40._M_string_length,&local_8c);
  }
  else {
    pcVar2 = local_40._M_dataplus._M_p + 1;
    local_8c = (int)*local_40._M_dataplus._M_p;
  }
  local_80.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)(pcVar2 != (char *)0x0);
  local_78 = (undefined8 *)0x0;
  if (pcVar2 == (char *)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_80,
               (AssertionResult *)
               "GetVarint32Ptr(s.data(), s.data() + s.size(), &result) != nullptr","false","true",
               in_R9);
    pcVar2 = (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p);
    line = 0x95;
LAB_0010a76d:
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/coding_test.cc"
               ,line,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    puVar3 = local_78;
    if (local_88._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_88._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
      puVar3 = local_78;
    }
  }
  else {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_60,"large_value","result",&local_6c,&local_8c);
    puVar3 = (undefined8 *)local_60._M_string_length;
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_80);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/coding_test.cc"
                 ,0x96,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
      puVar3 = (undefined8 *)local_60._M_string_length;
      if ((long *)CONCAT71(local_80.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_80.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_80.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_80.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
        puVar3 = (undefined8 *)local_60._M_string_length;
      }
    }
  }
  if (puVar3 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar3 != puVar3 + 2) {
      operator_delete((undefined8 *)*puVar3);
    }
    operator_delete(puVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Coding, Varint32Truncation) {
  uint32_t large_value = (1u << 31) + 100;
  std::string s;
  PutVarint32(&s, large_value);
  uint32_t result;
  for (size_t len = 0; len < s.size() - 1; len++) {
    ASSERT_TRUE(GetVarint32Ptr(s.data(), s.data() + len, &result) == nullptr);
  }
  ASSERT_TRUE(GetVarint32Ptr(s.data(), s.data() + s.size(), &result) !=
              nullptr);
  ASSERT_EQ(large_value, result);
}